

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

uint32_t FAudio_Initialize(FAudio *audio,uint32_t Flags,FAudioProcessor XAudio2Processor)

{
  code *pcVar1;
  int iVar2;
  uint32_t uVar3;
  float *pfVar4;
  int in_EDX;
  uint in_ESI;
  FAudio *in_RDI;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  bool local_19;
  
  do {
    local_19 = in_ESI < 2;
    if (local_19) goto LAB_001243a6;
    iVar2 = SDL_ReportAssertion(&FAudio_Initialize::sdl_assert_data,"FAudio_Initialize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                                ,0xd5);
  } while (iVar2 == 0);
  if (iVar2 == 1) {
    pcVar1 = (code *)swi(3);
    uVar3 = (*pcVar1)();
    return uVar3;
  }
LAB_001243a6:
  do {
    if (in_EDX == -1) goto LAB_001243f0;
    iVar2 = SDL_ReportAssertion(&FAudio_Initialize::sdl_assert_data_1,"FAudio_Initialize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                                ,0xd6);
  } while (iVar2 == 0);
  if (iVar2 == 1) {
    pcVar1 = (code *)swi(3);
    uVar3 = (*pcVar1)();
    return uVar3;
  }
LAB_001243f0:
  in_RDI->initFlags = in_ESI;
  pfVar4 = (float *)(*in_RDI->pMalloc)(4);
  in_RDI->decodeCache = pfVar4;
  pfVar4 = (float *)(*in_RDI->pMalloc)(4);
  in_RDI->resampleCache = pfVar4;
  in_RDI->decodeSamples = 1;
  in_RDI->resampleSamples = 1;
  FAudio_StartEngine(in_RDI);
  return 0;
}

Assistant:

uint32_t FAudio_Initialize(
	FAudio *audio,
	uint32_t Flags,
	FAudioProcessor XAudio2Processor
) {
	LOG_API_ENTER(audio)
	FAudio_assert(Flags == 0 || Flags == FAUDIO_DEBUG_ENGINE);
	FAudio_assert(XAudio2Processor == FAUDIO_DEFAULT_PROCESSOR);

	audio->initFlags = Flags;

	/* FIXME: This is lazy... */
	audio->decodeCache = (float*) audio->pMalloc(sizeof(float));
	audio->resampleCache = (float*) audio->pMalloc(sizeof(float));
	audio->decodeSamples = 1;
	audio->resampleSamples = 1;

	FAudio_StartEngine(audio);
	LOG_API_EXIT(audio)
	return 0;
}